

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::save_load_online_state(vw *all,io_buf *model_file,bool read,bool text,gd *g)

{
  float fVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  ostream *poVar5;
  io_buf *io;
  ostream *this;
  version_struct *this_00;
  ostream *v_str;
  stringstream *msg_00;
  byte in_CL;
  byte bVar6;
  byte in_DL;
  vw *in_RSI;
  long *in_RDI;
  vw *in_R8;
  sparse_parameters *unaff_retaddr;
  size_t temp_pass;
  double total_weight;
  float dump_interval;
  stringstream msg;
  undefined1 in_stack_fffffffffffffd2f;
  stringstream *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  undefined1 read_00;
  bool read_01;
  version_struct *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  io_buf *in_stack_fffffffffffffd58;
  shared_data *local_1c0;
  stringstream local_1a8 [16];
  ostream local_198;
  stringstream *in_stack_ffffffffffffffc0;
  gd *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  io_buf *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar6 = in_DL & 1;
  bVar3 = in_CL & 1;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar5 = std::operator<<(&local_198,"initial_t ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(float *)((long)in_RDI + 0x355c));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"norm normalizer ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)in_RDI[0x1a]);
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"t ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(double *)(*in_RDI + 0x18));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"sum_loss ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(double *)(*in_RDI + 0x40));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"sum_loss_since_last_dump ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(double *)(*in_RDI + 0x48));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  fVar1 = *(float *)(*in_RDI + 0x50);
  poVar5 = std::operator<<(&local_198,"dump_interval ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar1);
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  if (((bVar6 & 1) == 0) ||
     (((*(byte *)((long)in_RDI + 0x343a) & 1) != 0 && ((*(byte *)((long)in_RDI + 0x9f) & 1) != 0))))
  {
    *(float *)(*in_RDI + 0x50) = fVar1;
  }
  poVar5 = std::operator<<(&local_198,"min_label ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(float *)(*in_RDI + 0x68));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"max_label ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(float *)(*in_RDI + 0x6c));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"weighted_labeled_examples ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(double *)(*in_RDI + 0x20));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"weighted_labels ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(double *)(*in_RDI + 0x38));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"weighted_unlabeled_examples ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(double *)(*in_RDI + 0x30));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"example_number ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(ulong *)(*in_RDI + 8));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  poVar5 = std::operator<<(&local_198,"total_features ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(ulong *)(*in_RDI + 0x10));
  std::operator<<(poVar5,"\n");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
             in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
  if (((bVar6 & 1) == 0) ||
     (bVar4 = version_struct::operator>=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38), bVar4
     )) {
    read_00 = (undefined1)((ulong)in_stack_fffffffffffffd38 >> 0x38);
    local_1c0 = (shared_data *)0x0;
    if (((bVar6 & 1) == 0) && (in_R8 != (vw *)0x0)) {
      local_1c0 = in_R8->sd;
    }
    io = (io_buf *)std::operator<<(&local_198,"gd::total_weight ");
    poVar5 = (ostream *)std::ostream::operator<<(io,(double)local_1c0);
    std::operator<<(poVar5,"\n");
    bin_text_read_write_fixed
              (io,(char *)poVar5,in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
               (bool)read_00,in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
    if (((bVar6 & 1) != 0) && (in_R8 != (vw *)0x0)) {
      in_R8->sd = local_1c0;
    }
    this = std::operator<<(&local_198,"sd::oec.weighted_labeled_examples ");
    this_00 = (version_struct *)std::ostream::operator<<(this,*(double *)(*in_RDI + 0x28));
    std::operator<<((ostream *)this_00,"\n");
    bin_text_read_write_fixed
              (io,(char *)poVar5,(size_t)this,(char *)this_00,(bool)read_00,
               in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffd2f);
    v_str = std::operator<<(&local_198,"current_pass ");
    msg_00 = (stringstream *)std::ostream::operator<<(v_str,in_RDI[9]);
    std::operator<<((ostream *)msg_00,"\n");
    bVar4 = version_struct::operator>=(this_00,(char *)v_str);
    read_01 = SUB81((ulong)v_str >> 0x38,0);
    if (bVar4) {
      bin_text_read_write_fixed(io,(char *)poVar5,(size_t)this,(char *)this_00,read_01,msg_00,bVar4)
      ;
    }
    else {
      lVar2 = in_RDI[9];
      bin_text_read_write_fixed(io,(char *)poVar5,(size_t)this,(char *)this_00,read_01,msg_00,bVar4)
      ;
      in_RDI[9] = lVar2;
    }
  }
  if (((bVar6 & 1) != 0) &&
     (((*(byte *)((long)in_RDI + 0x343a) & 1) == 0 || ((*(byte *)((long)in_RDI + 0x9f) & 1) == 0))))
  {
    *(undefined8 *)(*in_RDI + 0x40) = 0;
    *(undefined8 *)(*in_RDI + 0x48) = 0;
    *(undefined8 *)(*in_RDI + 0x20) = 0;
    *(undefined8 *)(*in_RDI + 0x38) = 0;
    *(undefined8 *)(*in_RDI + 0x30) = 0;
    *(undefined8 *)(*in_RDI + 0x28) = 0;
    *(undefined8 *)(*in_RDI + 8) = 0;
    *(undefined8 *)(*in_RDI + 0x10) = 0;
    in_RDI[9] = 0;
  }
  if ((*(byte *)(in_RDI + 0x6b2) & 1) == 0) {
    save_load_online_state<dense_parameters>
              (in_R8,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7,
               (bool)in_stack_ffffffffffffffd6,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (dense_parameters *)in_RSI);
  }
  else {
    save_load_online_state<sparse_parameters>
              (in_RSI,(io_buf *)CONCAT17(bVar6,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
               SUB81((ulong)in_R8 >> 0x38,0),SUB81((ulong)in_R8 >> 0x30,0),
               (gd *)in_stack_ffffffffffffffd8,
               (stringstream *)
               CONCAT17(in_stack_ffffffffffffffd7,
                        CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),unaff_retaddr
              );
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g)
{
  // vw& all = *g.all;
  stringstream msg;

  msg << "initial_t " << all.initial_t << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.initial_t, sizeof(all.initial_t), "", read, msg, text);

  msg << "norm normalizer " << all.normalized_sum_norm_x << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.normalized_sum_norm_x, sizeof(all.normalized_sum_norm_x), "", read, msg, text);

  msg << "t " << all.sd->t << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->t, sizeof(all.sd->t), "", read, msg, text);

  msg << "sum_loss " << all.sd->sum_loss << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->sum_loss, sizeof(all.sd->sum_loss), "", read, msg, text);

  msg << "sum_loss_since_last_dump " << all.sd->sum_loss_since_last_dump << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->sum_loss_since_last_dump,
      sizeof(all.sd->sum_loss_since_last_dump), "", read, msg, text);

  float dump_interval = all.sd->dump_interval;
  msg << "dump_interval " << dump_interval << "\n";
  bin_text_read_write_fixed(model_file, (char*)&dump_interval, sizeof(dump_interval), "", read, msg, text);
  if (!read || (all.training && all.preserve_performance_counters))  // update dump_interval from input model
    all.sd->dump_interval = dump_interval;

  msg << "min_label " << all.sd->min_label << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->min_label, sizeof(all.sd->min_label), "", read, msg, text);

  msg << "max_label " << all.sd->max_label << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->max_label, sizeof(all.sd->max_label), "", read, msg, text);

  msg << "weighted_labeled_examples " << all.sd->weighted_labeled_examples << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->weighted_labeled_examples,
      sizeof(all.sd->weighted_labeled_examples), "", read, msg, text);

  msg << "weighted_labels " << all.sd->weighted_labels << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->weighted_labels, sizeof(all.sd->weighted_labels), "", read, msg, text);

  msg << "weighted_unlabeled_examples " << all.sd->weighted_unlabeled_examples << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->weighted_unlabeled_examples,
      sizeof(all.sd->weighted_unlabeled_examples), "", read, msg, text);

  msg << "example_number " << all.sd->example_number << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->example_number, sizeof(all.sd->example_number), "", read, msg, text);

  msg << "total_features " << all.sd->total_features << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->total_features, sizeof(all.sd->total_features), "", read, msg, text);

  if (!read || all.model_file_ver >= VERSION_SAVE_RESUME_FIX)
  {
    // restore some data to allow --save_resume work more accurate

    // fix average loss
    double total_weight = 0.;  // value holder as g* may be null
    if (!read && g != nullptr)
      total_weight = g->total_weight;
    msg << "gd::total_weight " << total_weight << "\n";
    bin_text_read_write_fixed(model_file, (char*)&total_weight, sizeof(total_weight), "", read, msg, text);
    if (read && g != nullptr)
      g->total_weight = total_weight;

    // fix "loss since last" for first printed out example details
    msg << "sd::oec.weighted_labeled_examples " << all.sd->old_weighted_labeled_examples << "\n";
    bin_text_read_write_fixed(model_file, (char*)&all.sd->old_weighted_labeled_examples,
        sizeof(all.sd->old_weighted_labeled_examples), "", read, msg, text);

    // fix "number of examples per pass"
    msg << "current_pass " << all.current_pass << "\n";
    if (all.model_file_ver >= VERSION_PASS_UINT64)
      bin_text_read_write_fixed(model_file, (char*)&all.current_pass, sizeof(all.current_pass), "", read, msg, text);
    else  // backwards compatiblity.
    {
      size_t temp_pass = (size_t)all.current_pass;
      bin_text_read_write_fixed(model_file, (char*)&temp_pass, sizeof(temp_pass), "", read, msg, text);
      all.current_pass = temp_pass;
    }
  }

  if (read &&
      (!all.training ||
          !all.preserve_performance_counters))  // reset various things so that we report test set performance properly
  {
    all.sd->sum_loss = 0;
    all.sd->sum_loss_since_last_dump = 0;
    all.sd->weighted_labeled_examples = 0.;
    all.sd->weighted_labels = 0.;
    all.sd->weighted_unlabeled_examples = 0.;
    all.sd->old_weighted_labeled_examples = 0.;
    all.sd->example_number = 0;
    all.sd->total_features = 0;
    all.current_pass = 0;
  }
  if (all.weights.sparse)
    save_load_online_state(all, model_file, read, text, g, msg, all.weights.sparse_weights);
  else
    save_load_online_state(all, model_file, read, text, g, msg, all.weights.dense_weights);
}